

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plytool.cpp
# Opt level: O0

void help(void)

{
  printf(
        "plytool provides a number of operations on PLY meshes.\n\nusage: plytool <command> [options]\n\nwhere <command> is:\n\ncat: Print a text representation of the mesh.\n\ndisplace: Apply displacement mapping to a mesh.\n\ninfo: Print general information about the mesh.\n\nsplit: Split the mesh into multiple PLY files.\n\n\"plytool help <command>\" provides detailed information about <command>.\n"
        );
  return;
}

Assistant:

static void help() {
    printf(R"(plytool provides a number of operations on PLY meshes.

usage: plytool <command> [options]

where <command> is:

cat: Print a text representation of the mesh.

displace: Apply displacement mapping to a mesh.

info: Print general information about the mesh.

split: Split the mesh into multiple PLY files.

"plytool help <command>" provides detailed information about <command>.
)");
}